

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::arith_stop_encoding(symbol_codec *this)

{
  bool bVar1;
  uint uVar2;
  symbol_codec *in_RDI;
  uint orig_base;
  uint in_stack_ffffffffffffffe8;
  uint uVar3;
  uint uVar4;
  bool local_1;
  
  uVar4 = in_RDI->m_arith_base;
  if (in_RDI->m_arith_length < 0x2000001) {
    in_RDI->m_arith_base = in_RDI->m_arith_base + 0x800000;
    in_RDI->m_arith_length = 0x8000;
  }
  else {
    in_RDI->m_arith_base = in_RDI->m_arith_base + 0x1000000;
    in_RDI->m_arith_length = 0x800000;
  }
  if (in_RDI->m_arith_base < uVar4) {
    arith_propagate_carry(in_RDI);
  }
  bVar1 = arith_renorm_enc_interval((symbol_codec *)CONCAT44(uVar4,in_stack_ffffffffffffffe8));
  if (bVar1) {
    while (uVar2 = vector<unsigned_char>::size(&in_RDI->m_arith_output_buf), uVar2 < 4) {
      uVar3 = in_stack_ffffffffffffffe8 & 0xffffff;
      bVar1 = vector<unsigned_char>::try_push_back
                        ((vector<unsigned_char> *)
                         (CONCAT44(uVar4,in_stack_ffffffffffffffe8) & 0xffffffff00ffffff),
                         (uchar *)in_RDI);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      in_RDI->m_total_bits_written = in_RDI->m_total_bits_written + 8;
      in_stack_ffffffffffffffe8 = uVar3;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool symbol_codec::arith_stop_encoding()
   {
      uint orig_base = m_arith_base;

      if (m_arith_length > 2 * cSymbolCodecArithMinLen)
      {
         m_arith_base  += cSymbolCodecArithMinLen;
         m_arith_length = (cSymbolCodecArithMinLen >> 1);
      }
      else
      {
         m_arith_base  += (cSymbolCodecArithMinLen >> 1);
         m_arith_length = (cSymbolCodecArithMinLen >> 9);
      }

      if (orig_base > m_arith_base)
         arith_propagate_carry();

      if (!arith_renorm_enc_interval())
         return false;

      while (m_arith_output_buf.size() < 4)
      {
         if (!m_arith_output_buf.try_push_back(0))
            return false;
         m_total_bits_written += 8;
      }
      return true;
   }